

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void nn_parse_options(nn_commandline *cline,void *target,int argc,char **argv)

{
  long *plVar1;
  char **ppcVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  nn_option *pnVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  nn_option *pnVar13;
  uint opt_index;
  ulong uVar14;
  size_t __size;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  nn_parse_context ctx;
  nn_parse_context local_98;
  char *local_40;
  long local_38;
  
  pnVar13 = cline->options;
  local_98.requires = (unsigned_long)cline->required_options;
  __size = 0xffffffffffffffff;
  pnVar7 = pnVar13;
  do {
    __size = __size + 1;
    ppcVar2 = &pnVar7->longname;
    pnVar7 = pnVar7 + 1;
  } while (*ppcVar2 != (char *)0x0);
  local_98.def = cline;
  local_98.options = pnVar13;
  local_98.target = target;
  local_98.argc = argc;
  local_98.argv = argv;
  local_98.last_option_usage = (char **)calloc(8,__size);
  if (local_98.last_option_usage == (char **)0x0) {
LAB_00104899:
    nn_parse_options_cold_4();
  }
  local_98.mask = 0;
  pcVar11 = *argv;
  local_98.args_left = argc - 1U;
  local_98.arg = argv;
  pcVar8 = strrchr(pcVar11,0x2f);
  pcVar10 = pcVar8 + 1;
  if (pcVar8 == (char *)0x0) {
    pcVar10 = pcVar11;
  }
  uVar12 = argc - 1U;
  if (pnVar13->longname != (char *)0x0) {
    lVar17 = 0x58;
    lVar18 = 0;
    pnVar7 = pnVar13;
    do {
      if ((pnVar7->arg0name != (char *)0x0) &&
         (iVar5 = strcmp(pcVar10,pnVar7->arg0name), iVar5 == 0)) {
        iVar5 = nn_has_arg((nn_option *)(ulong)pnVar7->type);
        if (iVar5 != 0) {
          __assert_fail("!nn_has_arg (opt)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                        ,0x220,"void nn_parse_arg0(struct nn_parse_context *)");
        }
        local_98.last_option_usage[lVar18] = *local_98.argv;
        nn_process_option(&local_98,(int)lVar18,(char *)0x0);
        pnVar13 = local_98.options;
      }
      lVar18 = lVar18 + 1;
      pnVar7 = (nn_option *)((long)&pnVar13->longname + lVar17);
      plVar1 = (long *)((long)&pnVar13->longname + lVar17);
      lVar17 = lVar17 + 0x58;
      uVar12 = local_98.args_left;
    } while (*plVar1 != 0);
  }
joined_r0x001045a7:
  do {
    ppcVar2 = local_98.arg;
    uVar3 = uVar12;
    if (uVar3 == 0) {
      local_98.arg = ppcVar2;
      nn_check_requires(&local_98);
      free(local_98.last_option_usage);
      return;
    }
    uVar16 = (ulong)uVar3;
    uVar12 = uVar3 - 1;
    local_98.arg = ppcVar2 + 1;
    pcVar11 = ppcVar2[1];
    local_98.args_left = uVar12;
    local_98.data = pcVar11;
    if (*pcVar11 != '-') {
LAB_00104810:
      nn_parse_options_cold_1();
      iVar5 = extraout_EAX;
LAB_0010481d:
      if (0 < iVar5) {
        nn_parse_options_cold_3();
      }
LAB_00104838:
      fprintf(_stderr,"%s: Unknown option ``%s\'\'\n",*local_98.argv,pcVar11);
      exit(1);
    }
    cVar4 = pcVar11[1];
    if (cVar4 == '-') {
      if (pcVar11[2] != '\0') {
        pcVar10 = (local_98.options)->longname;
        if (pcVar10 == (char *)0x0) goto LAB_00104838;
        local_40 = pcVar11 + 2;
        uVar9 = 0;
        uVar14 = 0xffffffff;
        uVar16 = 0;
        do {
          for (uVar15 = 0; (cVar4 = pcVar11[uVar15 + 2], cVar4 != '=' && (cVar4 != '\0'));
              uVar15 = uVar15 + 1) {
            if (cVar4 != pcVar10[uVar15]) goto LAB_0010465a;
          }
          iVar5 = (int)uVar15;
          if (pcVar10[uVar15] == '\0') {
            opt_index = (uint)uVar9;
            break;
          }
          iVar6 = (int)uVar16;
          if (iVar6 == iVar5) {
            uVar14 = 0xffffffff;
          }
          else {
            uVar15 = uVar15 & 0xffffffff;
            if (iVar5 < iVar6) {
              uVar15 = uVar16;
            }
            uVar16 = uVar15;
            if (iVar6 < iVar5) {
              uVar14 = uVar9 & 0xffffffff;
            }
          }
LAB_0010465a:
          iVar5 = (int)uVar16;
          opt_index = (uint)uVar14;
          uVar9 = uVar9 + 1;
          pcVar10 = local_98.options[uVar9].longname;
        } while (pcVar10 != (char *)0x0);
        if ((int)opt_index < 0) goto LAB_0010481d;
        local_98.last_option_usage[opt_index] = pcVar11;
        local_38 = (long)iVar5;
        cVar4 = pcVar11[local_38 + 2];
        iVar5 = nn_has_arg((nn_option *)(ulong)local_98.options[opt_index].type);
        if (cVar4 == '=') {
          if (iVar5 == 0) {
            pcVar11 = "does not accept argument";
LAB_0010488f:
            nn_option_error(pcVar11,&local_98,opt_index);
            goto LAB_00104899;
          }
          pcVar11 = local_40 + local_38 + 1;
        }
        else if (iVar5 == 0) {
          pcVar11 = (char *)0x0;
        }
        else {
          if (uVar12 == 0) {
            pcVar11 = "requires an argument";
            goto LAB_0010488f;
          }
          local_98.args_left = uVar3 - 2;
          local_98.arg = ppcVar2 + 2;
          pcVar11 = ppcVar2[2];
          local_98.data = pcVar11;
        }
        nn_process_option(&local_98,opt_index,pcVar11);
        uVar12 = local_98.args_left;
      }
      goto joined_r0x001045a7;
    }
    pcVar11 = pcVar11 + 1;
    while (uVar12 = local_98.args_left, local_98.data = pcVar11, cVar4 != '\0') {
      if ((local_98.options)->longname == (char *)0x0) {
LAB_001047f1:
        nn_parse_options_cold_2();
LAB_001047fe:
        nn_option_error("requires an argument",&local_98,(int)uVar16);
        goto LAB_00104810;
      }
      pcVar10 = &(local_98.options)->shortname;
      uVar16 = 0;
      while (*pcVar10 != cVar4) {
        uVar16 = uVar16 + 1;
        plVar1 = (long *)(pcVar10 + 0x50);
        pcVar10 = pcVar10 + 0x58;
        if (*plVar1 == 0) goto LAB_001047f1;
      }
      local_98.last_option_usage[uVar16] = pcVar11;
      iVar5 = nn_has_arg((nn_option *)(ulong)*(nn_option_type *)(pcVar10 + 0x10));
      if (iVar5 == 0) {
        nn_process_option(&local_98,(int)uVar16,(char *)0x0);
        pcVar11 = local_98.data + 1;
      }
      else {
        if (pcVar11[1] == '\0') {
          if (local_98.args_left == 0) goto LAB_001047fe;
          local_98.args_left = local_98.args_left - 1;
          pcVar11 = local_98.arg[1];
          local_98.arg = local_98.arg + 1;
          local_98.data = pcVar11;
        }
        else {
          pcVar11 = pcVar11 + 1;
        }
        nn_process_option(&local_98,(int)uVar16,pcVar11);
        pcVar11 = "";
      }
      cVar4 = *pcVar11;
    }
  } while( true );
}

Assistant:

void nn_parse_options (struct nn_commandline *cline,
    void *target, int argc, char **argv)
{
    struct nn_parse_context ctx;
    int num_options;

    ctx.def = cline;
    ctx.options = cline->options;
    ctx.target = target;
    ctx.argc = argc;
    ctx.argv = argv;
    ctx.requires = cline->required_options;

    for (num_options = 0; ctx.options[num_options].longname; ++num_options);
    ctx.last_option_usage = calloc (sizeof (char *), num_options);
    if  (!ctx.last_option_usage)
        nn_memory_error (&ctx);

    ctx.mask = 0;
    ctx.args_left = argc - 1;
    ctx.arg = argv;

    nn_parse_arg0 (&ctx);

    while (nn_get_arg (&ctx)) {
        nn_parse_arg (&ctx);
    }

    nn_check_requires (&ctx);

    free (ctx.last_option_usage);

}